

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O0

FT_F26Dot6 Round_Down_To_Grid(TT_ExecContext exc,FT_F26Dot6 distance,FT_Int color)

{
  long lVar1;
  ulong uVar2;
  ulong local_30;
  FT_F26Dot6 val;
  FT_F26Dot6 compensation;
  FT_Int color_local;
  FT_F26Dot6 distance_local;
  TT_ExecContext exc_local;
  
  lVar1 = (exc->tt_metrics).compensations[color];
  if (distance < 0) {
    uVar2 = lVar1 - distance & 0xffffffffffffffc0;
    local_30 = -uVar2;
    if ((long)uVar2 < 0) {
      local_30 = 0;
    }
  }
  else {
    local_30 = distance + lVar1 & 0xffffffffffffffc0;
    if ((long)local_30 < 0) {
      local_30 = 0;
    }
  }
  return local_30;
}

Assistant:

static FT_F26Dot6
  Round_Down_To_Grid( TT_ExecContext  exc,
                      FT_F26Dot6      distance,
                      FT_Int          color )
  {
    FT_F26Dot6  compensation = exc->tt_metrics.compensations[color];
    FT_F26Dot6  val;


    if ( distance >= 0 )
    {
      val = FT_PIX_FLOOR( ADD_LONG( distance, compensation ) );
      if ( val < 0 )
        val = 0;
    }
    else
    {
      val = NEG_LONG( FT_PIX_FLOOR( SUB_LONG( compensation, distance ) ) );
      if ( val > 0 )
        val = 0;
    }

    return val;
  }